

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi_uc *psVar1;
  bool bVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  float *output;
  stbi_uc *psVar10;
  stbi_uc *psVar11;
  int req_comp_00;
  int req_comp_01;
  undefined8 extraout_RDX;
  stbi_uc *psVar12;
  stbi_uc *extraout_RDX_00;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  stbi_uc *psVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  stbi_uc rgbe_1 [4];
  stbi_uc rgbe [4];
  char buffer [1024];
  stbi_uc *local_4b8;
  long local_4a0;
  stbi_uc *local_498;
  stbi_uc local_48c [4];
  ulong local_488;
  long local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  ulong local_460;
  ulong local_458;
  stbi_uc *local_450;
  char *local_448;
  stbi_uc local_43c;
  stbi_uc local_43b;
  stbi_uc local_43a;
  stbi_uc local_439;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  stbi__hdr_gettoken(s,&local_438);
  if ((CONCAT17(cStack_42e,
                CONCAT16(cStack_42f,
                         CONCAT15(cStack_430,
                                  CONCAT14(cStack_431,
                                           CONCAT13(cStack_432,
                                                    CONCAT12(cStack_433,
                                                             CONCAT11(cStack_434,cStack_435)))))))
       != 0x45434e41494441 ||
       CONCAT17(cStack_431,
                CONCAT16(cStack_432,
                         CONCAT15(cStack_433,
                                  CONCAT14(cStack_434,
                                           CONCAT13(cStack_435,
                                                    CONCAT12(cStack_436,
                                                             CONCAT11(cStack_437,local_438))))))) !=
       0x4e41494441523f23) &&
     (CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) != 0x454247 ||
      CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) != 0x47523f23)) {
    pcVar7 = "not HDR";
    goto LAB_00125e92;
  }
  stbi__hdr_gettoken(s,&local_438);
  if (local_438 != '\0') {
    bVar2 = false;
    do {
      auVar19[0] = -(cStack_431 == '3');
      auVar19[1] = -(cStack_430 == '2');
      auVar19[2] = -(cStack_42f == '-');
      auVar19[3] = -(cStack_42e == 'b');
      auVar19[4] = -(cStack_42d == 'i');
      auVar19[5] = -(cStack_42c == 't');
      auVar19[6] = -(cStack_42b == '_');
      auVar19[7] = -(cStack_42a == 'r');
      auVar19[8] = -(cStack_429 == 'l');
      auVar19[9] = -(cStack_428 == 'e');
      auVar19[10] = -(cStack_427 == '_');
      auVar19[0xb] = -(cStack_426 == 'r');
      auVar19[0xc] = -(cStack_425 == 'g');
      auVar19[0xd] = -(cStack_424 == 'b');
      auVar19[0xe] = -(cStack_423 == 'e');
      auVar19[0xf] = -(cStack_422 == '\0');
      auVar20[0] = -(local_438 == 'F');
      auVar20[1] = -(cStack_437 == 'O');
      auVar20[2] = -(cStack_436 == 'R');
      auVar20[3] = -(cStack_435 == 'M');
      auVar20[4] = -(cStack_434 == 'A');
      auVar20[5] = -(cStack_433 == 'T');
      auVar20[6] = -(cStack_432 == '=');
      auVar20[7] = -(cStack_431 == '3');
      auVar20[8] = -(cStack_430 == '2');
      auVar20[9] = -(cStack_42f == '-');
      auVar20[10] = -(cStack_42e == 'b');
      auVar20[0xb] = -(cStack_42d == 'i');
      auVar20[0xc] = -(cStack_42c == 't');
      auVar20[0xd] = -(cStack_42b == '_');
      auVar20[0xe] = -(cStack_42a == 'r');
      auVar20[0xf] = -(cStack_429 == 'l');
      auVar20 = auVar20 & auVar19;
      if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
        bVar2 = true;
      }
      stbi__hdr_gettoken(s,&local_438);
    } while (local_438 != '\0');
    if (bVar2) {
      stbi__hdr_gettoken(s,&local_438);
      if (cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d) {
        local_448 = &cStack_435;
        uVar8 = strtol(local_448,&local_448,10);
        local_448 = local_448 + 2;
        do {
          pcVar7 = local_448;
          local_448 = pcVar7 + 1;
        } while (pcVar7[-2] == ' ');
        if (((pcVar7[-2] == '+') && (pcVar7[-1] == 'X')) && (*pcVar7 == ' ')) {
          uVar9 = strtol(local_448,(char **)0x0,10);
          uVar14 = (uint)uVar8;
          if (((int)uVar14 < 0x1000001) && (uVar15 = (uint)uVar9, (int)uVar15 < 0x1000001)) {
            *x = uVar15;
            *y = uVar14;
            if (comp != (int *)0x0) {
              *comp = 3;
            }
            if (-1 < (int)(uVar15 | uVar14)) {
              if (uVar14 == 0) {
LAB_00125ecb:
                output = (float *)malloc((ulong)(uVar15 * uVar14 * 0x10));
                if (output != (float *)0x0) {
                  iVar16 = 0;
                  if (uVar15 - 0x8000 < 0xffff8008) goto LAB_0012632a;
                  if ((int)uVar14 < 1) {
                    return output;
                  }
                  local_460 = uVar9 << 2;
                  local_458 = local_460 & 0xffffffff;
                  local_450 = s->buffer_start;
                  psVar1 = s->buffer_start + 1;
                  local_468 = uVar9 & 0xffffffff;
                  local_470 = (ulong)(uVar14 & 0x7fffffff);
                  local_4a0 = 0;
                  local_488 = 0;
                  local_4b8 = (stbi_uc *)0x0;
                  local_478 = uVar8;
                  while( true ) {
                    sVar3 = stbi__get8(s);
                    sVar4 = stbi__get8(s);
                    sVar5 = stbi__get8(s);
                    if (((sVar3 != '\x02') || (sVar4 != '\x02')) || ((char)sVar5 < '\0')) {
                      local_43c = sVar3;
                      local_43b = sVar4;
                      local_43a = sVar5;
                      local_439 = stbi__get8(s);
                      stbi__hdr_convert(output,&local_43c,req_comp_00);
                      free(local_4b8);
                      iVar16 = 0;
                      iVar6 = 1;
                      uVar8 = local_478;
                      do {
                        stbi__getn(s,local_48c,4);
                        stbi__hdr_convert(output + (long)(int)(uVar15 * iVar16 * 4) +
                                                   (long)(iVar6 * 4),local_48c,req_comp_01);
                        iVar6 = iVar6 + 1;
                        while ((int)uVar15 <= iVar6) {
                          iVar16 = iVar16 + 1;
LAB_0012632a:
                          iVar6 = 0;
                          if ((int)uVar8 <= iVar16) {
                            return output;
                          }
                        }
                      } while( true );
                    }
                    sVar3 = stbi__get8(s);
                    if (CONCAT11(sVar5,sVar3) != uVar15) break;
                    if ((local_4b8 == (stbi_uc *)0x0) &&
                       (local_4b8 = (stbi_uc *)malloc(local_458), local_4b8 == (stbi_uc *)0x0)) {
                      free(output);
                      goto LAB_0012631c;
                    }
                    psVar18 = local_450;
                    local_480 = 0;
                    local_498 = local_4b8;
                    do {
                      iVar16 = 0;
                      uVar8 = uVar9 & 0xffffffff;
                      do {
                        psVar12 = s->img_buffer;
                        psVar10 = s->img_buffer_end;
                        if (psVar12 < psVar10) {
                          psVar11 = psVar12 + 1;
                          s->img_buffer = psVar11;
                          psVar12 = (stbi_uc *)CONCAT71((int7)((ulong)psVar12 >> 8),*psVar12);
LAB_00126078:
                          uVar14 = (uint)psVar12;
                          uVar13 = uVar14 & 0xff;
                          if ((byte)psVar12 < 0x81) {
                            if ((uint)uVar8 < uVar13) goto LAB_00126296;
                            if (((ulong)psVar12 & 0xff) != 0) {
                              lVar17 = 0;
                              do {
                                psVar10 = s->img_buffer;
                                if (psVar10 < s->img_buffer_end) {
                                  s->img_buffer = psVar10 + 1;
                                  sVar3 = *psVar10;
                                }
                                else if (s->read_from_callbacks == 0) {
                                  sVar3 = '\0';
                                }
                                else {
                                  iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen)
                                  ;
                                  s->callback_already_read =
                                       s->callback_already_read +
                                       (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                                  if (iVar6 == 0) {
                                    s->read_from_callbacks = 0;
                                    s->buffer_start[0] = '\0';
                                    sVar3 = '\0';
                                    psVar12 = psVar1;
                                  }
                                  else {
                                    sVar3 = *psVar18;
                                    psVar12 = psVar18 + iVar6;
                                  }
                                  s->img_buffer_end = psVar12;
                                  s->img_buffer = psVar1;
                                  psVar12 = psVar1;
                                }
                                local_498[lVar17 * 4 + (long)iVar16 * 4] = sVar3;
                                lVar17 = lVar17 + 1;
                              } while (uVar13 != (uint)lVar17);
                              iVar16 = iVar16 + (uint)lVar17;
                            }
                          }
                          else {
                            if (psVar11 < psVar10) {
                              s->img_buffer = psVar11 + 1;
                              sVar3 = *psVar11;
                            }
                            else if (s->read_from_callbacks == 0) {
                              sVar3 = '\0';
                            }
                            else {
                              iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
                              s->callback_already_read =
                                   s->callback_already_read +
                                   (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                              if (iVar6 == 0) {
                                s->read_from_callbacks = 0;
                                s->buffer_start[0] = '\0';
                                sVar3 = '\0';
                                psVar10 = psVar1;
                              }
                              else {
                                sVar3 = *psVar18;
                                psVar10 = psVar18 + iVar6;
                              }
                              s->img_buffer_end = psVar10;
                              s->img_buffer = psVar1;
                              psVar12 = (stbi_uc *)((ulong)psVar12 & 0xffffffff);
                            }
                            uVar14 = uVar14 & 0x7f;
                            if ((uint)uVar8 < uVar14) {
LAB_00126296:
                              free(output);
                              free(local_4b8);
                              pcVar7 = "corrupt";
                              goto LAB_00125e92;
                            }
                            uVar8 = (ulong)psVar12 & 0x7f;
                            psVar12 = (stbi_uc *)((ulong)psVar12 & 0xffffffffffffff7f);
                            if (uVar8 != 0) {
                              psVar12 = (stbi_uc *)0x0;
                              do {
                                local_498[(long)psVar12 * 4 + (long)iVar16 * 4] = sVar3;
                                psVar12 = psVar12 + 1;
                              } while (uVar14 != (uint)psVar12);
                              iVar16 = iVar16 + (uint)psVar12;
                            }
                          }
                        }
                        else if (s->read_from_callbacks != 0) {
                          iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
                          s->callback_already_read =
                               s->callback_already_read +
                               (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                          if (iVar6 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            psVar12 = (stbi_uc *)0x0;
                            psVar10 = psVar1;
                          }
                          else {
                            psVar12 = (stbi_uc *)CONCAT71((int7)((ulong)extraout_RDX >> 8),*psVar18)
                            ;
                            psVar10 = psVar18 + iVar6;
                          }
                          s->img_buffer_end = psVar10;
                          s->img_buffer = psVar1;
                          psVar11 = psVar1;
                          goto LAB_00126078;
                        }
                        uVar8 = (ulong)(uVar15 - iVar16);
                      } while (uVar15 - iVar16 != 0 && iVar16 <= (int)uVar15);
                      local_480 = local_480 + 1;
                      local_498 = local_498 + 1;
                    } while (local_480 != 4);
                    local_480 = 4;
                    uVar8 = local_468;
                    lVar17 = local_4a0;
                    psVar18 = local_4b8;
                    do {
                      stbi__hdr_convert(output + ((uint)lVar17 & 0xfffffffc),psVar18,(int)psVar12);
                      lVar17 = lVar17 + 4;
                      psVar18 = psVar18 + 4;
                      uVar8 = uVar8 - 1;
                      psVar12 = extraout_RDX_00;
                    } while (uVar8 != 0);
                    local_488 = local_488 + 1;
                    local_4a0 = local_4a0 + local_460;
                    if (local_488 == local_470) {
                      free(local_4b8);
                      return output;
                    }
                  }
                  free(output);
                  free(local_4b8);
                  pcVar7 = "invalid decoded scanline length";
                  goto LAB_00125e92;
                }
              }
              else {
                if (((int)(0x7fffffff / (uVar8 & 0xffffffff)) < (int)uVar15) ||
                   (0x7ffffff < uVar15 * uVar14)) goto LAB_00125ec2;
                if ((int)uVar15 <= (int)(0x7fffffff / (uVar8 & 0xffffffff))) goto LAB_00125ecb;
              }
LAB_0012631c:
              pcVar7 = "outofmem";
              goto LAB_00125e92;
            }
          }
LAB_00125ec2:
          pcVar7 = "too large";
          goto LAB_00125e92;
        }
      }
      pcVar7 = "unsupported data layout";
      goto LAB_00125e92;
    }
  }
  pcVar7 = "unsupported format";
LAB_00125e92:
  *(char **)(in_FS_OFFSET + -8) = pcVar7;
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   if (height > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");
   if (width > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}